

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator|
          (CharClass<unsigned_char> *__return_storage_ptr__,CharClass<unsigned_char> *this,
          Range<unsigned_char> *r)

{
  vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  *this_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  __first;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  __last;
  
  CharClass(__return_storage_ptr__);
  __first._M_current =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  for (__last._M_current = __first._M_current;
      (__last._M_current !=
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish &&
      ((r->m_end < (__last._M_current)->m_start || ((__last._M_current)->m_end < r->m_start))));
      __last._M_current = __last._M_current + 1) {
  }
  this_00 = &__return_storage_ptr__->m_ranges;
  std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
  insert<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,void>
            ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
              *)this_00,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,__first,__last);
  for (; __last._M_current !=
         (this->m_ranges).
         super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ._M_impl.super__Vector_impl_data._M_finish; __last._M_current = __last._M_current + 1) {
    bVar1 = (__last._M_current)->m_start;
    bVar2 = r->m_end;
    if (bVar2 < bVar1) break;
    bVar3 = (__last._M_current)->m_end;
    bVar4 = r->m_start;
    if (bVar3 < bVar4) break;
    if (bVar1 < bVar4) {
      bVar4 = bVar1;
    }
    if (bVar3 < bVar2) {
      bVar3 = bVar2;
    }
    r->m_start = bVar4;
    r->m_end = bVar3;
  }
  std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
  push_back(this_00,r);
  std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
  insert<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,void>
            ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
              *)this_00,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,__last,
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator|(Range<TCHAR> r) const
    {
        CharClass<TCHAR> cc;

        auto i = m_ranges.cbegin();

        for (; i != m_ranges.cend() && !i->overlaps(r); i++)
            ;
        
        cc.m_ranges.insert(cc.m_ranges.end(), m_ranges.cbegin(), i);

        for (; i != m_ranges.cend() && i->overlaps(r); i++)
        {
            r = r.merge(*i);
        }

        cc.m_ranges.push_back(r);

        cc.m_ranges.insert(cc.m_ranges.end(), i, m_ranges.cend());

        return cc;
    }